

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O2

NULLCRef * NULLC::ReplaceObject(NULLCRef l,NULLCRef r)

{
  ExternTypeInfo *pEVar1;
  char *pcVar2;
  char *pcVar3;
  NULLCRef *in_RDI;
  FastVector<char,_false,_false> *pFVar4;
  uint in_stack_00000008;
  undefined4 in_stack_0000000c;
  undefined4 in_stack_00000010;
  uint in_stack_00000018;
  void *in_stack_0000001c;
  
  if (in_stack_00000008 == in_stack_00000018) {
    pEVar1 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                       ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200),
                        in_stack_00000008);
    memcpy((void *)CONCAT44(in_stack_00000010,in_stack_0000000c),in_stack_0000001c,
           (ulong)pEVar1->size);
  }
  else {
    pFVar4 = (FastVector<char,_false,_false> *)(linker + 0x290);
    pEVar1 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                       ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200),
                        in_stack_00000018);
    pcVar2 = FastVector<char,_false,_false>::operator[](pFVar4,pEVar1->offsetToName);
    pFVar4 = (FastVector<char,_false,_false> *)(linker + 0x290);
    pEVar1 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                       ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200),
                        in_stack_00000008);
    pcVar3 = FastVector<char,_false,_false>::operator[](pFVar4,pEVar1->offsetToName);
    nullcThrowError("ERROR: cannot convert from %s ref to %s ref",pcVar2,pcVar3);
  }
  *(undefined4 *)((long)&in_RDI->ptr + 4) = in_stack_00000010;
  *(ulong *)in_RDI = CONCAT44(in_stack_0000000c,in_stack_00000008);
  return in_RDI;
}

Assistant:

NULLCRef NULLC::ReplaceObject(NULLCRef l, NULLCRef r)
{
	if(l.typeID != r.typeID)
	{
		nullcThrowError("ERROR: cannot convert from %s ref to %s ref", &linker->exSymbols[linker->exTypes[r.typeID].offsetToName], &linker->exSymbols[linker->exTypes[l.typeID].offsetToName]);
		return l;
	}
	memcpy(l.ptr, r.ptr, linker->exTypes[r.typeID].size);
	return l;
}